

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCEtriangleShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtCEtriangleShape::localGetSupportingVertexWithoutMargin(cbtCEtriangleShape *this,cbtVector3 *vec0)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  ChVector<double> *pCVar4;
  ChVector<double> *pCVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar21 [16];
  undefined1 in_ZMM10 [64];
  undefined1 in_register_000014c4 [12];
  cbtVector3 cVar22;
  
  pCVar4 = this->p1;
  pCVar5 = this->p2;
  auVar12._0_4_ = (float)pCVar4->m_data[0];
  auVar12._4_12_ = in_ZMM0._4_12_;
  auVar14._0_4_ = (float)pCVar4->m_data[1];
  auVar14._4_12_ = in_ZMM1._4_12_;
  auVar17._0_4_ = (float)pCVar4->m_data[2];
  auVar17._4_12_ = in_ZMM2._4_12_;
  cVar1 = vec0->m_floats[0];
  fVar2 = vec0->m_floats[1];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar14._0_4_)),ZEXT416((uint)cVar1),auVar12);
  cVar3 = vec0->m_floats[2];
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar3),auVar17);
  uVar7 = SUB128(ZEXT812(0),4);
  if (-1e+18 < auVar6._0_4_) {
    auVar12 = vinsertps_avx(auVar12,auVar14,0x10);
    uVar11 = auVar12._0_8_;
    auVar8._4_8_ = uVar7;
    auVar8._0_4_ = auVar17._0_4_;
    uVar13 = auVar8._0_8_;
  }
  else {
    uVar11 = 0;
    uVar13 = 0;
  }
  auVar6 = vmaxss_avx(auVar6,SUB6416(ZEXT464(0xdd5e0b6b),0));
  auVar18._0_4_ = (float)pCVar5->m_data[0];
  auVar20._4_12_ = in_ZMM9._4_12_;
  auVar18._4_12_ = auVar20._4_12_;
  auVar20._0_4_ = (float)pCVar5->m_data[1];
  auVar21._0_4_ = (float)pCVar5->m_data[2];
  auVar21._4_12_ = in_ZMM10._4_12_;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar2)),ZEXT416((uint)cVar1),auVar18);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar3),auVar21);
  if (auVar6._0_4_ < auVar12._0_4_) {
    auVar14 = vinsertps_avx(auVar18,auVar20,0x10);
    uVar11 = auVar14._0_8_;
    auVar9._4_8_ = uVar7;
    auVar9._0_4_ = auVar21._0_4_;
    uVar13 = auVar9._0_8_;
  }
  auVar6 = vmaxss_avx(auVar12,auVar6);
  pCVar4 = this->p3;
  auVar15._0_4_ = (float)pCVar4->m_data[0];
  auVar15._4_12_ = in_register_000014c4;
  auVar16._0_4_ = (float)pCVar4->m_data[1];
  auVar16._4_12_ = in_register_000014c4;
  auVar19._0_4_ = (float)pCVar4->m_data[2];
  auVar19._4_12_ = in_register_000014c4;
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)cVar1),auVar15,ZEXT416((uint)(fVar2 * auVar16._0_4_)));
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)cVar3),auVar19,auVar12);
  if (auVar6._0_4_ < auVar12._0_4_) {
    auVar6 = vinsertps_avx(auVar15,auVar16,0x10);
    uVar11 = auVar6._0_8_;
    auVar10._4_8_ = uVar7;
    auVar10._0_4_ = auVar19._0_4_;
    uVar13 = auVar10._0_8_;
  }
  cVar22.m_floats[2] = (cbtScalar)(int)uVar13;
  cVar22.m_floats[3] = (cbtScalar)(int)((ulong)uVar13 >> 0x20);
  cVar22.m_floats[0] = (cbtScalar)(int)uVar11;
  cVar22.m_floats[1] = (cbtScalar)(int)((ulong)uVar11 >> 0x20);
  return (cbtVector3)cVar22.m_floats;
}

Assistant:

cbtVector3	cbtCEtriangleShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
    cbtVector3 supVec(cbtScalar(0.),cbtScalar(0.),cbtScalar(0.));
	cbtScalar newDot,maxDot = cbtScalar(-BT_LARGE_FLOAT);
    cbtVector3 vtx;
	vtx = cbtVector3((cbtScalar)this->p1->x(),(cbtScalar)this->p1->y(),(cbtScalar)this->p1->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}
    vtx = cbtVector3((cbtScalar)this->p2->x(),(cbtScalar)this->p2->y(),(cbtScalar)this->p2->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}
    vtx = cbtVector3((cbtScalar)this->p3->x(),(cbtScalar)this->p3->y(),(cbtScalar)this->p3->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}

	return supVec;  //+ vec0.normalized()*this->sphereswept_rad; //***TODO*** add the sphereswept_rad layer (but gives seldom jittering.. why?)
}